

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

ostream * Kernel::operator<<(ostream *out,Clause *self)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  SplitSet *pSVar4;
  ostream *poVar5;
  Clause *in_RSI;
  SharedSet<unsigned_int> *in_RDI;
  ostream *unaff_retaddr;
  uint i;
  SharedSet<unsigned_int> *s;
  undefined4 in_stack_ffffffffffffffe0;
  uint n;
  Literal *in_stack_fffffffffffffff8;
  
  uVar2 = Clause::size(in_RSI);
  if (uVar2 == 0) {
    in_RDI = (SharedSet<unsigned_int> *)std::operator<<((ostream *)in_RDI,"$false");
  }
  else {
    s = in_RDI;
    Clause::operator[](in_RSI,0);
    operator<<(unaff_retaddr,in_stack_fffffffffffffff8);
    uVar2 = 1;
    while (n = uVar2, uVar3 = Clause::size(in_RSI), uVar2 < uVar3) {
      std::operator<<((ostream *)in_RDI," | ");
      Clause::operator[](in_RSI,n);
      operator<<(unaff_retaddr,in_stack_fffffffffffffff8);
      uVar2 = n + 1;
    }
    pSVar4 = Clause::splits((Clause *)0x842c67);
    if (pSVar4 != (SplitSet *)0x0) {
      pSVar4 = Clause::splits((Clause *)0x842c77);
      bVar1 = Lib::SharedSet<unsigned_int>::isEmpty(pSVar4);
      if (!bVar1) {
        std::operator<<((ostream *)in_RDI,"{");
        Clause::splits((Clause *)0x842ca3);
        poVar5 = Lib::operator<<((ostream *)CONCAT44(n,in_stack_ffffffffffffffe0),s);
        std::operator<<(poVar5,"}");
      }
    }
  }
  return (ostream *)in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Clause const& self)
{
  if (self.size() == 0) {
    return out << "$false";
  } else {
    out << *self[0];
    for (unsigned i = 1; i < self.size(); i++){
      out << " | " << *self[i];
    }
    if (self.splits() && !self.splits()->isEmpty()) {
      out << "{" << *self.splits() << "}";
    }
  }
  return out;
}